

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cc
# Opt level: O2

void brotli::BuildMetaBlockGreedy
               (uint8_t *ringbuffer,size_t pos,size_t mask,Command *commands,size_t n_commands,
               MetaBlockSplit *mb)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  Command *pCVar5;
  size_t num_symbols;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  BlockSplitter<brotli::Histogram<520>_> dist_blocks;
  BlockSplitter<brotli::Histogram<704>_> cmd_blocks;
  BlockSplitter<brotli::Histogram<256>_> lit_blocks;
  
  num_symbols = 0;
  pCVar5 = commands;
  sVar6 = n_commands;
  while (bVar9 = sVar6 != 0, sVar6 = sVar6 - 1, bVar9) {
    num_symbols = num_symbols + pCVar5->insert_len_;
    pCVar5 = pCVar5 + 1;
  }
  BlockSplitter<brotli::Histogram<256>_>::BlockSplitter
            (&lit_blocks,0x100,0x200,400.0,num_symbols,&mb->literal_split,&mb->literal_histograms);
  BlockSplitter<brotli::Histogram<704>_>::BlockSplitter
            (&cmd_blocks,0x2c0,0x400,500.0,n_commands,&mb->command_split,&mb->command_histograms);
  BlockSplitter<brotli::Histogram<520>_>::BlockSplitter
            (&dist_blocks,0x40,0x200,100.0,n_commands,&mb->distance_split,&mb->distance_histograms);
  for (sVar6 = 0; sVar6 != n_commands; sVar6 = sVar6 + 1) {
    uVar3 = commands[sVar6].insert_len_;
    uVar4 = commands[sVar6].copy_len_;
    uVar1 = commands[sVar6].cmd_prefix_;
    uVar2 = commands[sVar6].dist_prefix_;
    BlockSplitter<brotli::Histogram<704>_>::AddSymbol(&cmd_blocks,(ulong)uVar1);
    uVar7 = pos;
    for (lVar8 = 0; -lVar8 != (ulong)uVar3; lVar8 = lVar8 + -1) {
      BlockSplitter<brotli::Histogram<256>_>::AddSymbol(&lit_blocks,(ulong)ringbuffer[uVar7 & mask])
      ;
      uVar7 = uVar7 + 1;
    }
    if ((ulong)uVar4 != 0 && 0x7f < uVar1) {
      BlockSplitter<brotli::Histogram<520>_>::AddSymbol(&dist_blocks,(ulong)uVar2);
    }
    pos = (pos + uVar4) - lVar8;
  }
  BlockSplitter<brotli::Histogram<256>_>::FinishBlock(&lit_blocks,true);
  BlockSplitter<brotli::Histogram<704>_>::FinishBlock(&cmd_blocks,true);
  BlockSplitter<brotli::Histogram<520>_>::FinishBlock(&dist_blocks,true);
  return;
}

Assistant:

void BuildMetaBlockGreedy(const uint8_t* ringbuffer,
                          size_t pos,
                          size_t mask,
                          const Command *commands,
                          size_t n_commands,
                          MetaBlockSplit* mb) {
  size_t num_literals = 0;
  for (size_t i = 0; i < n_commands; ++i) {
    num_literals += commands[i].insert_len_;
  }

  BlockSplitter<HistogramLiteral> lit_blocks(
      256, 512, 400.0, num_literals,
      &mb->literal_split, &mb->literal_histograms);
  BlockSplitter<HistogramCommand> cmd_blocks(
      kNumCommandPrefixes, 1024, 500.0, n_commands,
      &mb->command_split, &mb->command_histograms);
  BlockSplitter<HistogramDistance> dist_blocks(
      64, 512, 100.0, n_commands,
      &mb->distance_split, &mb->distance_histograms);

  for (size_t i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    cmd_blocks.AddSymbol(cmd.cmd_prefix_);
    for (size_t j = cmd.insert_len_; j != 0; --j) {
      lit_blocks.AddSymbol(ringbuffer[pos & mask]);
      ++pos;
    }
    pos += cmd.copy_len_;
    if (cmd.copy_len_ > 0 && cmd.cmd_prefix_ >= 128) {
      dist_blocks.AddSymbol(cmd.dist_prefix_);
    }
  }

  lit_blocks.FinishBlock(/* is_final = */ true);
  cmd_blocks.FinishBlock(/* is_final = */ true);
  dist_blocks.FinishBlock(/* is_final = */ true);
}